

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O2

void __thiscall
CVmObjByteArray::copy_from_buf(CVmObjByteArray *this,uchar *buf,unsigned_long idx,size_t len)

{
  uint uVar1;
  ulong uVar2;
  ulong __n;
  
  for (; len != 0; len = len - __n) {
    uVar1 = (uint)(idx - 1);
    uVar2 = (ulong)(uVar1 & 0x7fff);
    __n = 0x8000 - uVar2;
    if (len <= __n) {
      __n = len;
    }
    memcpy((void *)(uVar2 + *(long *)(*(long *)((this->super_CVmObject).ext_ +
                                               (idx - 1 >> 0x1c) * 8 + 4) +
                                     (ulong)(uVar1 >> 0xc & 0xfff8))),buf,__n);
    buf = buf + __n;
    idx = idx + __n;
  }
  return;
}

Assistant:

void CVmObjByteArray::copy_from_buf(const unsigned char *buf,
                                    unsigned long idx, size_t len)
{
    /* keep going until we satisfy the request */
    while (len != 0)
    {
        size_t avail;
        unsigned char *p;
        size_t copy_len;

        /* get the next chunk */
        p = get_ele_ptr(idx, &avail);

        /* copy the available bytes or the remaining desired bytes */
        copy_len = avail;
        if (copy_len > len)
            copy_len = len;

        /* copy the bytes */
        memcpy(p, buf, copy_len);

        /* advance past the copied bytes */
        buf += copy_len;
        idx += copy_len;
        len -= copy_len;
    }
}